

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyValueFile.h
# Opt level: O2

string * __thiscall
KeyValueFile::trimStr(string *__return_storage_ptr__,KeyValueFile *this,string *s)

{
  char cVar1;
  pointer pcVar2;
  ulong uVar3;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  allocator local_9;
  
  uVar5 = (uint)s->_M_string_length;
  uVar7 = 1;
  if ((int)uVar5 < 1) {
    uVar7 = uVar5;
  }
  for (uVar3 = (ulong)(uVar5 - 1);
      (uVar8 = uVar7, 1 < (int)uVar5 &&
      ((cVar1 = (s->_M_dataplus)._M_p[uVar3], cVar1 == ' ' || (uVar8 = uVar5, cVar1 == '\t'))));
      uVar3 = uVar3 - 1) {
    uVar5 = uVar5 - 1;
  }
  uVar6 = 0;
  uVar3 = (ulong)uVar8;
  if ((int)uVar8 < 1) {
    uVar3 = uVar6;
  }
  lVar4 = 1;
  while( true ) {
    uVar5 = uVar5 - 1;
    if (uVar3 == uVar6) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_9);
      return __return_storage_ptr__;
    }
    pcVar2 = (s->_M_dataplus)._M_p;
    if ((pcVar2[uVar6] != ' ') && (pcVar2[uVar6] != '\t')) break;
    uVar6 = uVar6 + 1;
    lVar4 = lVar4 + 1;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,pcVar2 + uVar6,pcVar2 + lVar4 + (int)uVar5);
  return __return_storage_ptr__;
}

Assistant:

std::string trimStr(std::string s)
  {
    int from = 0;
    int to = int(s.length()) - 1;
    while (to > 0 && isSpace(s[to]))
      to--;
    while (from <= to && isSpace(s[from]))
      from++;
    if (to < from)
      return std::string("");
    return std::string(&(s[from]), to - from + 1);
  }